

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cc
# Opt level: O0

int absl::DefaultStackUnwinder
              (void **pcs,int *sizes,int depth,int skip,void *uc,int *min_dropped_frames)

{
  int iVar1;
  int n;
  int x;
  Unwinder f;
  int *min_dropped_frames_local;
  void *uc_local;
  int skip_local;
  int depth_local;
  int *sizes_local;
  void **pcs_local;
  
  if (sizes == (int *)0x0) {
    if (uc == (void *)0x0) {
      _n = UnwindImpl<false,false>;
    }
    else {
      _n = UnwindImpl<false,true>;
    }
  }
  else if (uc == (void *)0x0) {
    _n = UnwindImpl<true,false>;
  }
  else {
    _n = UnwindImpl<true,true>;
  }
  iVar1 = (*_n)(pcs,sizes,depth,skip + 1,uc,min_dropped_frames);
  return iVar1;
}

Assistant:

int DefaultStackUnwinder(void** pcs, int* sizes, int depth, int skip,
                         const void* uc, int* min_dropped_frames) {
  skip++;  // For this function
  Unwinder f = nullptr;
  if (sizes == nullptr) {
    if (uc == nullptr) {
      f = &UnwindImpl<false, false>;
    } else {
      f = &UnwindImpl<false, true>;
    }
  } else {
    if (uc == nullptr) {
      f = &UnwindImpl<true, false>;
    } else {
      f = &UnwindImpl<true, true>;
    }
  }
  volatile int x = 0;
  int n = (*f)(pcs, sizes, depth, skip, uc, min_dropped_frames);
  x = 1; (void) x;  // To disable tail call to (*f)(...)
  return n;
}